

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O1

_Bool fs_stdio_update_entry(ALLEGRO_FS_ENTRY *fp)

{
  uint uVar1;
  ALLEGRO_FS_INTERFACE *pAVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  ALLEGRO_FS_INTERFACE *pAVar6;
  
  iVar3 = stat((char *)fp[1].vtable,(stat *)(fp + 3));
  if (iVar3 == -1) {
    piVar5 = __errno_location();
    al_set_errno(*piVar5);
  }
  else {
    pAVar2 = fp[6].vtable;
    *(uint *)&fp[2].vtable =
         ((uint)(((ulong)pAVar2 & 0x120) != 0) | (uint)(((ulong)pAVar2 & 0xf000) == 0x4000) << 4) +
         (uint)(((ulong)pAVar2 & 0x90) != 0) * 2 + 0x10;
    if (((ulong)pAVar2 & 0x48) != 0) {
      *(byte *)&fp[2].vtable = *(byte *)&fp[2].vtable | 4;
    }
    uVar1 = *(uint *)&fp[2].vtable;
    if ((uVar1 & 8) == 0) {
      pAVar2 = fp[1].vtable;
      pcVar4 = strrchr((char *)pAVar2,0x2f);
      pAVar6 = (ALLEGRO_FS_INTERFACE *)(pcVar4 + 1);
      if (pcVar4 == (char *)0x0) {
        pAVar6 = pAVar2;
      }
      if (*(char *)&pAVar6->fs_create_entry == '.') {
        *(uint *)&fp[2].vtable = uVar1 | 8;
      }
    }
  }
  return iVar3 != -1;
}

Assistant:

static bool fs_stdio_update_entry(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   int ret;

   ret = WRAP_STAT(fp_stdio->abs_path, &(fp_stdio->st));
   if (ret == -1) {
      al_set_errno(errno);
      return false;
   }

   fs_update_stat_mode(fp_stdio);

   return true;
}